

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O0

void highbd_warp_horizontal_filter_alpha0
               (uint16_t *ref,__m128i *tmp,int stride,int32_t ix4,int32_t iy4,int32_t sx4,int alpha,
               int beta,int p_height,int height,int i,int offset_bits_horiz,int reduce_bits_horiz)

{
  int in_R9D;
  __m128i coeff [8];
  __m128i src2;
  __m128i src;
  int sx;
  int iy;
  int k;
  int in_stack_00000250;
  int local_f0;
  longlong local_e8 [8];
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  __m128i *in_stack_ffffffffffffff60;
  __m128i *in_stack_ffffffffffffff68;
  __m128i *in_stack_ffffffffffffff70;
  __m128i *in_stack_ffffffffffffff78;
  int local_34;
  
  local_34 = -7;
  while( true ) {
    if ((int)coeff[0][1] - (int)coeff[1][1] < 9) {
      local_f0 = (int)coeff[0][1] - (int)coeff[1][1];
    }
    else {
      local_f0 = 8;
    }
    if (local_f0 <= local_34) break;
    highbd_prepare_horizontal_filter_coeff_alpha0
              (in_R9D + (int)coeff[0][0] * (local_34 + 4),(__m128i *)local_e8);
    highbd_filter_src_pixels
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
               in_stack_00000250);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

static inline void highbd_warp_horizontal_filter_alpha0(
    const uint16_t *ref, __m128i *tmp, int stride, int32_t ix4, int32_t iy4,
    int32_t sx4, int alpha, int beta, int p_height, int height, int i,
    const int offset_bits_horiz, const int reduce_bits_horiz) {
  (void)alpha;
  int k;
  for (k = -7; k < AOMMIN(8, p_height - i); ++k) {
    int iy = iy4 + k;
    if (iy < 0)
      iy = 0;
    else if (iy > height - 1)
      iy = height - 1;
    int sx = sx4 + beta * (k + 4);

    // Load source pixels
    const __m128i src =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
    const __m128i src2 =
        _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 + 1));

    __m128i coeff[8];
    highbd_prepare_horizontal_filter_coeff_alpha0(sx, coeff);
    highbd_filter_src_pixels(&src, &src2, tmp, coeff, offset_bits_horiz,
                             reduce_bits_horiz, k);
  }
}